

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

uint uv_available_parallelism(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  cpu_set_t set;
  cpu_set_t local_88;
  
  local_88.__bits[0xe] = 0;
  local_88.__bits[0xf] = 0;
  local_88.__bits[0xc] = 0;
  local_88.__bits[0xd] = 0;
  local_88.__bits[10] = 0;
  local_88.__bits[0xb] = 0;
  local_88.__bits[8] = 0;
  local_88.__bits[9] = 0;
  local_88.__bits[6] = 0;
  local_88.__bits[7] = 0;
  local_88.__bits[4] = 0;
  local_88.__bits[5] = 0;
  local_88.__bits[2] = 0;
  local_88.__bits[3] = 0;
  local_88.__bits[0] = 0;
  local_88.__bits[1] = 0;
  iVar1 = sched_getaffinity(0,0x80,&local_88);
  if (iVar1 == 0) {
    iVar1 = __sched_cpucount(0x80,&local_88);
    lVar2 = (long)iVar1;
  }
  else {
    lVar2 = sysconf(0x54);
  }
  lVar3 = 1;
  if (1 < lVar2) {
    lVar3 = lVar2;
  }
  return (uint)lVar3;
}

Assistant:

unsigned int uv_available_parallelism(void) {
#ifdef __linux__
  cpu_set_t set;
  long rc;

  memset(&set, 0, sizeof(set));

  /* sysconf(_SC_NPROCESSORS_ONLN) in musl calls sched_getaffinity() but in
   * glibc it's... complicated... so for consistency try sched_getaffinity()
   * before falling back to sysconf(_SC_NPROCESSORS_ONLN).
   */
  if (0 == sched_getaffinity(0, sizeof(set), &set))
    rc = CPU_COUNT(&set);
  else
    rc = sysconf(_SC_NPROCESSORS_ONLN);

  if (rc < 1)
    rc = 1;

  return (unsigned) rc;
#elif defined(__MVS__)
  int rc;

  rc = __get_num_online_cpus();
  if (rc < 1)
    rc = 1;

  return (unsigned) rc;
#else  /* __linux__ */
  long rc;

  rc = sysconf(_SC_NPROCESSORS_ONLN);
  if (rc < 1)
    rc = 1;

  return (unsigned) rc;
#endif  /* __linux__ */
}